

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * conditional(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Obj *var;
  C_Token *pCVar5;
  C_Token *start;
  C_Token *local_40;
  C_Token *local_38;
  
  local_40 = tok;
  pCVar2 = logand(parser,&local_40,tok);
  while( true ) {
    pCVar5 = local_40;
    _Var1 = C_equal(local_40,"||");
    if (!_Var1) break;
    pCVar3 = logand(parser,&local_40,pCVar5->next);
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = ND_LOGOR;
    pCVar4->tok = pCVar5;
    pCVar4->lhs = pCVar2;
    pCVar4->rhs = pCVar3;
    pCVar2 = pCVar4;
  }
  local_38 = pCVar5;
  _Var1 = C_equal(pCVar5,"?");
  if (_Var1) {
    _Var1 = C_equal(pCVar5->next,":");
    if (_Var1) {
      C_add_type(parser,pCVar2);
      var = new_lvar(parser,"",pCVar2->ty);
      pCVar3 = new_var_node(parser,var,pCVar5);
      pCVar4 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar4->kind = ND_ASSIGN;
      pCVar4->tok = pCVar5;
      pCVar4->lhs = pCVar3;
      pCVar4->rhs = pCVar2;
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_COND;
      pCVar3->tok = pCVar5;
      pCVar2 = new_var_node(parser,var,pCVar5);
      pCVar3->cond = pCVar2;
      pCVar2 = new_var_node(parser,var,pCVar5);
      pCVar3->then = pCVar2;
      pCVar2 = conditional(parser,rest,pCVar5->next->next);
      pCVar3->els = pCVar2;
      pCVar2 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar2->kind = ND_COMMA;
      pCVar2->tok = pCVar5;
      pCVar2->lhs = pCVar4;
      pCVar2->rhs = pCVar3;
    }
    else {
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_COND;
      pCVar3->tok = pCVar5;
      pCVar3->cond = pCVar2;
      pCVar2 = expr(parser,&local_38,pCVar5->next);
      pCVar3->then = pCVar2;
      pCVar5 = C_skip(parser,local_38,":");
      pCVar2 = conditional(parser,rest,pCVar5);
      pCVar3->els = pCVar2;
      pCVar2 = pCVar3;
    }
  }
  else {
    *rest = pCVar5;
  }
  return pCVar2;
}

Assistant:

static C_Node *conditional(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *cond = logor(parser, &tok, tok);

  if (!C_equal(tok, "?")) {
    *rest = tok;
    return cond;
  }

  if (C_equal(tok->next, ":")) {
    // [GNU] Compile `a ?: b` as `tmp = a, tmp ? tmp : b`.
    C_add_type(parser, cond);
    C_Obj *var = new_lvar(parser, "", cond->ty);
    C_Node *lhs = new_binary(parser, ND_ASSIGN, new_var_node(parser, var, tok), cond, tok);
    C_Node *rhs = new_node(parser, ND_COND, tok);
    rhs->cond = new_var_node(parser, var, tok);
    rhs->then = new_var_node(parser, var, tok);
    rhs->els = conditional(parser, rest, tok->next->next);
    return new_binary(parser, ND_COMMA, lhs, rhs, tok);
  }

  C_Node *node = new_node(parser, ND_COND, tok);
  node->cond = cond;
  node->then = expr(parser, &tok, tok->next);
  tok = C_skip(parser, tok, ":");
  node->els = conditional(parser, rest, tok);
  return node;
}